

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O2

int nghttp2_map_init(nghttp2_map *map,nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_map_bucket *pnVar2;
  
  map->mem = mem;
  map->tablelen = 0x100;
  map->tablelenbits = 8;
  pnVar2 = (nghttp2_map_bucket *)nghttp2_mem_calloc(mem,0x100,0x10);
  map->table = pnVar2;
  if (pnVar2 == (nghttp2_map_bucket *)0x0) {
    iVar1 = -0x385;
  }
  else {
    map->size = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_map_init(nghttp2_map *map, nghttp2_mem *mem) {
  map->mem = mem;
  map->tablelen = 1 << NGHTTP2_INITIAL_TABLE_LENBITS;
  map->tablelenbits = NGHTTP2_INITIAL_TABLE_LENBITS;
  map->table =
      nghttp2_mem_calloc(mem, map->tablelen, sizeof(nghttp2_map_bucket));
  if (map->table == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  map->size = 0;

  return 0;
}